

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O3

void mxx::impl::distribute_container<std::vector<int,_std::allocator<int>_>_>::distribute_inplace
               (vector<int,_std::allocator<int>_> *c,comm *comm)

{
  _func_int **pp_Var1;
  pointer piVar2;
  ulong total_size;
  void *pvVar3;
  _func_int **pp_Var4;
  pointer puVar5;
  _func_int *p_Var6;
  long lVar7;
  size_type __new_size;
  int rank_1;
  int result;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  signed_size_t surplus;
  custom_op<unsigned_long> op;
  uint local_bc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  ulong local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  long local_80;
  custom_op<unsigned_long> local_78;
  
  if (comm->m_size != 1) {
    local_a0 = (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
    custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_78,1);
    MPI_Allreduce(&local_a0,&local_b8,1,local_78.m_type_copy,local_78.m_op,comm->mpi_comm);
    total_size = CONCAT44(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (uint)local_b8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    custom_op<unsigned_long>::~custom_op(&local_78);
    __new_size = total_size / (uint)comm->m_size +
                 (ulong)((ulong)(uint)comm->m_rank < total_size % (ulong)(uint)comm->m_size);
    local_78._vptr_custom_op =
         (_func_int **)CONCAT44(local_78._vptr_custom_op._4_4_,(uint)(local_a0 == total_size));
    MPI_Allreduce(&local_78,&local_b8,1,&ompi_mpi_int,&ompi_mpi_op_lor,comm->mpi_comm);
    if ((uint)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start == 0) {
      local_80 = local_a0 - __new_size;
      allgather<long>((vector<long,_std::allocator<long>_> *)&local_78,&local_80,1,comm);
      if (local_78._vptr_custom_op !=
          (_func_int **)local_78.m_user_func.super__Function_base._M_functor._M_unused._0_8_) {
        p_Var6 = (_func_int *)0x0;
        pp_Var4 = local_78._vptr_custom_op;
        do {
          p_Var6 = p_Var6 + (long)*pp_Var4;
          pp_Var4 = pp_Var4 + 1;
        } while (pp_Var4 !=
                 (_func_int **)local_78.m_user_func.super__Function_base._M_functor._M_unused._0_8_)
        ;
        if (p_Var6 != (_func_int *)0x0) {
          MPI_Comm_rank(&ompi_mpi_comm_world,&local_b8);
          printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
                 (ulong)(uint)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                 ,0x147,"distribute_inplace",
                 "std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0"
                );
          fflush(_stdout);
          MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
        }
      }
      surplus_send_pairing
                (&local_b8,(vector<long,_std::allocator<long>_> *)&local_78,comm->m_size,
                 comm->m_rank,false);
      all2all<unsigned_long>(&local_98,&local_b8,comm);
      if (local_80 < 1) {
        puVar5 = (pointer)CONCAT44(local_b8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_b8.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        if (puVar5 != local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          lVar7 = 0;
          do {
            lVar7 = lVar7 + *puVar5;
            puVar5 = puVar5 + 1;
          } while (puVar5 != local_b8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
          if (lVar7 != 0) {
            MPI_Comm_rank(&ompi_mpi_comm_world,&local_bc);
            printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_bc,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                   ,0x153,"distribute_inplace",
                   "std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0"
                  );
            fflush(_stdout);
            MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
          }
        }
        std::vector<int,_std::allocator<int>_>::resize(c,__new_size);
        all2allv<int>((int *)0x0,&local_b8,
                      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + local_a0,&local_98,comm);
      }
      else {
        if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar7 = 0;
          puVar5 = local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            lVar7 = lVar7 + *puVar5;
            puVar5 = puVar5 + 1;
          } while (puVar5 != local_98.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
          if (lVar7 != 0) {
            MPI_Comm_rank(&ompi_mpi_comm_world,&local_bc);
            printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_bc,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                   ,0x14e,"distribute_inplace",
                   "std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0"
                  );
            fflush(_stdout);
            MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
          }
        }
        all2allv<int>((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + (local_a0 - local_80),&local_b8,(int *)0x0,
                      &local_98,comm);
        std::vector<int,_std::allocator<int>_>::resize(c,__new_size);
      }
      if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar3 = (void *)CONCAT44(local_b8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)local_b8.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)local_b8.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar3);
      }
    }
    else {
      local_78._vptr_custom_op = (_func_int **)0x0;
      local_78.m_user_func.super__Function_base._M_functor._M_unused._M_object = (pointer)0x0;
      local_78.m_user_func.super__Function_base._M_functor._8_8_ = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&local_78,__new_size);
      distribute_scatter<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 local_78._vptr_custom_op,total_size,comm);
      pp_Var4 = (_func_int **)
                (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start;
      pp_Var1 = (_func_int **)
                (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish;
      piVar2 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_78._vptr_custom_op;
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_78.m_user_func.super__Function_base._M_functor._M_unused._0_8_;
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)local_78.m_user_func.super__Function_base._M_functor._8_8_;
      local_78._vptr_custom_op = pp_Var4;
      local_78.m_user_func.super__Function_base._M_functor._M_unused._M_object = pp_Var1;
      local_78.m_user_func.super__Function_base._M_functor._8_8_ = piVar2;
    }
    if (local_78._vptr_custom_op != (_func_int **)0x0) {
      operator_delete(local_78._vptr_custom_op,
                      local_78.m_user_func.super__Function_base._M_functor._8_8_ -
                      (long)local_78._vptr_custom_op);
    }
  }
  return;
}

Assistant:

inline static void distribute_inplace(Container& c, const mxx::comm& comm) {
        // custom implementation: don't need full sized buffers, only for receiving surpluses)
        // if single process, don't do anything
        if (comm.size() == 1)
            return;

        typedef typename std::iterator_traits<decltype(std::begin(c))>::value_type T;

        // get sizes
        size_t local_size = c.size();
        size_t total_size = mxx::allreduce(local_size, comm);
        blk_dist part(total_size, comm.size(), comm.rank());

        if (mxx::any_of(local_size == total_size, comm)) {
            // use scatterv instead of all2all based communication
            Container result;
            result.resize(part.local_size());
            impl::distribute_scatter(std::begin(c), std::end(c), std::begin(result), total_size, comm);
            c.swap(result);
        } else {
            // use surplus send-pairing to minimize total communication volume
            // TODO: use all2all or send/recv depending on the maximum number of
            //       paired processes

            // get surplus
            impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

            // allgather surpluses
            // TODO figure out how to do surplus send pairing without requiring allgather
            std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
            MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0);

            // get send counts
            std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
            std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

            if (surplus > 0) {
                MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0);
                // TODO: use iterators not pointers
                mxx::all2allv(&(*(std::begin(c)+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
                c.resize(part.local_size());
            } else {
                MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0);
                c.resize(part.local_size());
                mxx::all2allv((T*)nullptr, send_counts, &(*(std::begin(c)+local_size)), recv_counts, comm);
            }
        }
    }